

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O1

void __thiscall
wasm::MergeSimilarFunctions::collectEquivalentClasses
          (MergeSimilarFunctions *this,
          vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *classes,
          Module *module)

{
  size_t *__dest;
  pointer *pppFVar1;
  pointer puVar2;
  Function *pFVar3;
  iterator iVar4;
  vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *this_00;
  pointer pEVar5;
  bool bVar6;
  mapped_type_conflict *__k;
  vector<wasm::Function*,std::allocator<wasm::Function*>> *this_01;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  pointer puVar9;
  long lVar10;
  value_type *pvVar11;
  ulong uVar12;
  undefined1 auVar13 [8];
  bool bVar14;
  initializer_list<wasm::Function_*> __l;
  initializer_list<wasm::EquivalentClass> __l_00;
  initializer_list<wasm::Function_*> __l_01;
  PassRunner local_390;
  undefined1 local_2a0 [8];
  map<unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  hashGroups;
  pointer local_198;
  pointer local_188;
  _Any_data local_168;
  _Manager_type local_158;
  undefined1 local_148 [8];
  Map hashes;
  function<bool_(wasm::Expression_*,_unsigned_long_&)> ignoringConsts;
  _Any_data local_f0;
  code *local_e0;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> local_d0;
  MergeSimilarFunctions *local_b8;
  vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *local_b0;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> local_a8;
  undefined1 local_90 [8];
  vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> classesInGroup;
  EquivalentClass local_60;
  Function *local_40;
  Function *func;
  
  local_b8 = this;
  FunctionHasher::createMap((Map *)local_148,module);
  local_390.options.arguments._M_h._M_buckets = &local_390.options.arguments._M_h._M_single_bucket;
  local_390._vptr_PassRunner = (_func_int **)&PTR__PassRunner_01091270;
  local_390.allocator = &module->allocator;
  local_390.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_390.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_390.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_390.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_390._41_8_ = 0;
  local_390.options.validate = true;
  local_390.options.validateGlobally = true;
  local_390.options.optimizeLevel = 0;
  local_390.options.shrinkLevel = 0;
  local_390.options.inlining.alwaysInlineMaxSize = 2;
  local_390.options.inlining.oneCallerInlineMaxSize = 0xffffffff;
  local_390.options.inlining.flexibleInlineMaxSize = 0x14;
  local_390.options.inlining.allowFunctionsWithLoops = false;
  local_390.options.printStackIR.
  super__Optional_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_true,_true>._M_payload.
  super__Optional_payload_base<std::basic_ostream<char,_std::char_traits<char>_>_*>._M_engaged =
       false;
  local_390.options.targetJS = false;
  local_390.options.inlining.partialInliningIfs = 0;
  local_390.options.ignoreImplicitTraps = false;
  local_390.options.trapsNeverHappen = false;
  local_390.options.lowMemoryUnused = false;
  local_390.options.fastMath = false;
  local_390.options.zeroFilledMemory = false;
  local_390.options.closedWorld = false;
  local_390.options.debugInfo = false;
  local_390.options.generateStackIR = false;
  local_390.options.optimizeStackIR = false;
  local_390.options.arguments._M_h._M_bucket_count = 1;
  local_390.options.arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_390.options.arguments._M_h._M_element_count = 0;
  local_390.options.arguments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_390.options.arguments._M_h._M_rehash_policy._M_next_resize = 0;
  local_390.options.arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_390.options.passesToSkip._M_h._M_buckets =
       &local_390.options.passesToSkip._M_h._M_single_bucket;
  local_390.options.passesToSkip._M_h._M_bucket_count = 1;
  local_390.options.passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_390.options.passesToSkip._M_h._M_element_count = 0;
  local_390.options.passesToSkip._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_390.options.passesToSkip._M_h._M_rehash_policy._M_next_resize = 0;
  local_390.options.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_390.isNested = false;
  local_390.addedPassesRemovedDWARF = false;
  hashes.
  super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&hashes.
                super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_390.wasm = module;
  std::function<bool_(wasm::Expression_*,_unsigned_long_&)>::function
            ((function<bool_(wasm::Expression_*,_unsigned_long_&)> *)&local_f0,
             (function<bool_(wasm::Expression_*,_unsigned_long_&)> *)
             hashes.
             super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_node_count);
  FunctionHasher::FunctionHasher
            ((FunctionHasher *)local_2a0,(Map *)local_148,(ExprHasher *)&local_f0);
  WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>::
  run((WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
       *)local_2a0,&local_390,module);
  local_2a0 = (undefined1  [8])&PTR__FunctionHasher_010920e0;
  if (local_158 != (_Manager_type)0x0) {
    (*local_158)(&local_168,&local_168,__destroy_functor);
  }
  if (local_198 != (pointer)0x0) {
    operator_delete(local_198,(long)local_188 - (long)local_198);
  }
  local_b0 = classes;
  Pass::~Pass((Pass *)local_2a0);
  if (local_e0 != (code *)0x0) {
    (*local_e0)(&local_f0,&local_f0,__destroy_functor);
  }
  hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&hashGroups;
  hashGroups._M_t._M_impl._0_4_ = 0;
  hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  puVar9 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (puVar9 != puVar2) {
    do {
      pFVar3 = (puVar9->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar3->super_Importable).module + 8) == (char *)0x0) {
        local_60.primaryFunction = pFVar3;
        __k = std::
              map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
              ::operator[]((map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                            *)local_148,&local_60.primaryFunction);
        this_01 = (vector<wasm::Function*,std::allocator<wasm::Function*>> *)
                  std::
                  map<unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                  ::operator[]((map<unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                                *)local_2a0,__k);
        iVar4._M_current = *(Function ***)(this_01 + 8);
        if (iVar4._M_current == *(Function ***)(this_01 + 0x10)) {
          std::vector<wasm::Function*,std::allocator<wasm::Function*>>::
          _M_realloc_insert<wasm::Function*const&>(this_01,iVar4,&local_60.primaryFunction);
        }
        else {
          *iVar4._M_current = local_60.primaryFunction;
          *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
        }
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar2);
  }
  p_Var8 = hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&hashGroups) {
    do {
      p_Var7 = p_Var8[1]._M_parent;
      if (8 < (ulong)((long)p_Var8[1]._M_left - (long)p_Var7)) {
        pFVar3 = *(Function **)p_Var7;
        local_40 = *(Function **)p_Var7;
        __l._M_len = 1;
        __l._M_array = &local_40;
        std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                  (&local_d0,__l,
                   (allocator_type *)
                   &classesInGroup.
                    super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_60.primaryFunction = pFVar3;
        std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                  (&local_60.functions,&local_d0);
        __l_00._M_len = 1;
        __l_00._M_array = &local_60;
        std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>::vector
                  ((vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *)local_90
                   ,__l_00,(allocator_type *)((long)&func + 7));
        if (local_60.functions.
            super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.functions.
                          super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_60.functions.
                                super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.functions.
                                super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d0.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.
                          super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_d0.
                                super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.
                                super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        p_Var7 = p_Var8[1]._M_parent;
        if (8 < (ulong)((long)p_Var8[1]._M_left - (long)p_Var7)) {
          uVar12 = 1;
          do {
            pEVar5 = classesInGroup.
                     super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_40 = *(Function **)(&p_Var7->_M_color + uVar12 * 2);
            if (local_90 ==
                (undefined1  [8])
                classesInGroup.
                super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>.
                _M_impl.super__Vector_impl_data._M_start) {
LAB_0097791d:
              pFVar3 = local_40;
              classesInGroup.
              super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_40;
              __l_01._M_len = 1;
              __l_01._M_array =
                   (iterator)
                   &classesInGroup.
                    super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                        (&local_a8,__l_01,(allocator_type *)((long)&func + 7));
              local_60.primaryFunction = pFVar3;
              std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                        (&local_60.functions,&local_a8);
              std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>::
              emplace_back<wasm::EquivalentClass>
                        ((vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *)
                         local_90,&local_60);
              if (local_60.functions.
                  super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_60.functions.
                                super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_60.functions.
                                      super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_60.functions.
                                      super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_a8.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_a8.
                                super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_a8.
                                      super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_a8.
                                      super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              bVar14 = false;
              auVar13 = local_90;
              do {
                pvVar11 = (value_type *)((long)auVar13 + 0x20);
                bVar6 = areInEquvalentClass(local_b8,((value_type *)auVar13)->primaryFunction,
                                            local_40,module);
                if (bVar6) {
                  iVar4._M_current =
                       (((value_type *)auVar13)->functions).
                       super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar4._M_current ==
                      (((value_type *)auVar13)->functions).
                      super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    bVar14 = true;
                    std::vector<wasm::Function*,std::allocator<wasm::Function*>>::
                    _M_realloc_insert<wasm::Function*const&>
                              ((vector<wasm::Function*,std::allocator<wasm::Function*>> *)
                               &((value_type *)auVar13)->functions,iVar4,&local_40);
                  }
                  else {
                    *iVar4._M_current = local_40;
                    pppFVar1 = &(((value_type *)auVar13)->functions).
                                super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                    *pppFVar1 = *pppFVar1 + 1;
                    bVar14 = true;
                  }
                }
                auVar13 = (undefined1  [8])pvVar11;
              } while (!bVar6 && pvVar11 != pEVar5);
              if (!bVar14) goto LAB_0097791d;
            }
            uVar12 = (ulong)((int)uVar12 + 1);
            p_Var7 = p_Var8[1]._M_parent;
          } while (uVar12 < (ulong)((long)p_Var8[1]._M_left - (long)p_Var7 >> 3));
        }
        this_00 = local_b0;
        lVar10 = (long)classesInGroup.
                       super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)local_90 >> 5;
        if (0 < lVar10) {
          lVar10 = lVar10 + 1;
          auVar13 = local_90;
          do {
            std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>::push_back
                      (this_00,(value_type *)auVar13);
            auVar13 = (undefined1  [8])((long)auVar13 + 0x20);
            lVar10 = lVar10 + -1;
          } while (1 < lVar10);
        }
        std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>::~vector
                  ((vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *)local_90
                  );
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != (_Rb_tree_node_base *)&hashGroups);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
               *)local_2a0);
  __dest = &hashes.
            super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
            ._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Function_handler<bool_(wasm::Expression_*,_unsigned_long_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MergeSimilarFunctions.cpp:290:5)>
  ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
  PassRunner::~PassRunner(&local_390);
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
               *)local_148);
  return;
}

Assistant:

void MergeSimilarFunctions::collectEquivalentClasses(
  std::vector<EquivalentClass>& classes, Module* module) {
  auto hashes = FunctionHasher::createMap(module);
  PassRunner runner(module);

  std::function<bool(Expression*, size_t&)> ignoringConsts =
    [&](Expression* expr, size_t& digest) {
      // Ignore const's immediate operands.
      if (expr->is<Const>()) {
        return true;
      }
      // Ignore callee operands.
      if (auto* call = expr->dynCast<Call>()) {
        for (auto operand : call->operands) {
          rehash(digest,
                 ExpressionAnalyzer::flexibleHash(operand, ignoringConsts));
        }
        rehash(digest, call->isReturn);
        return true;
      }
      return false;
    };
  FunctionHasher(&hashes, ignoringConsts).run(&runner, module);

  // Find hash-equal groups.
  std::map<size_t, std::vector<Function*>> hashGroups;
  ModuleUtils::iterDefinedFunctions(
    *module, [&](Function* func) { hashGroups[hashes[func]].push_back(func); });

  for (auto& [_, hashGroup] : hashGroups) {
    if (hashGroup.size() < 2) {
      continue;
    }

    // Collect exactly equivalent functions ignoring constants.
    std::vector<EquivalentClass> classesInGroup = {
      EquivalentClass(hashGroup[0], {hashGroup[0]})};

    for (Index i = 1; i < hashGroup.size(); i++) {
      auto* func = hashGroup[i];
      bool found = false;
      for (auto& newClass : classesInGroup) {
        if (areInEquvalentClass(newClass.primaryFunction, func, module)) {
          newClass.functions.push_back(func);
          found = true;
          break;
        }
      }

      if (!found) {
        // Same hash but different instruction pattern.
        classesInGroup.push_back(EquivalentClass(func, {func}));
      }
    }
    std::copy(classesInGroup.begin(),
              classesInGroup.end(),
              std::back_inserter(classes));
  }
}